

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

EColorRange V_FindFontColor(FName *name)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  iVar2 = TranslationLookup.Count - 1;
  if (-1 < iVar2) {
    iVar4 = 0;
    do {
      uVar3 = (uint)(iVar4 + iVar2) >> 1;
      iVar1 = TranslationLookup.Array[uVar3].Name.Index;
      if (iVar1 == name->Index) {
        return TranslationLookup.Array[uVar3].Number;
      }
      if (iVar1 < name->Index) {
        iVar4 = uVar3 + 1;
      }
      else {
        iVar2 = uVar3 - 1;
      }
    } while (iVar4 <= iVar2);
  }
  return CR_UNTRANSLATED;
}

Assistant:

unsigned int Size () const
	{
		return Count;
	}